

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
                 *this,Index target,Index eventIndex)

{
  node_ptr plVar1;
  ID_index IVar2;
  Index source;
  Column *pCVar3;
  Column_support *pCVar4;
  ID_index pivot;
  Index target_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
  *local_40;
  anon_class_8_1_8991fb9c get_column_with_pivot_;
  
  local_40 = &this->reducedMatrixR_;
  target_local = target;
  get_column_with_pivot_.this = this;
  pCVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
           ::get_column(local_40,target);
  plVar1 = (pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar4 = &pCVar3->column_;
  pivot = 0xffffffff;
  if (plVar1 != (node_ptr)pCVar4 && plVar1 != (node_ptr)0x0) {
    pivot = *(ID_index *)
             &(pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  while( true ) {
    IVar2 = pivot;
    source = _reduce_column::anon_class_8_1_8991fb9c::operator()(&get_column_with_pivot_,pivot);
    if (IVar2 == 0xffffffff) {
      Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
      ::get_column_dimension(local_40,target);
      return;
    }
    if (source == 0xffffffff) break;
    _reduce_column_by(this,target,source);
    plVar1 = (pCVar4->super_type).data_.root_plus_size_.m_header.super_node.next_;
    pivot = 0xffffffff;
    if (plVar1 != (node_ptr)pCVar4 && plVar1 != (node_ptr)0x0) {
      pivot = *(ID_index *)
               &(pCVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                next_;
    }
  }
  std::
  unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
  ::try_emplace<unsigned_int&>
            ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
              *)&this->pivotToColumnIndex_,&pivot,&target_local);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}